

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

Result * cfWriteconfig(Result *__return_storage_ptr__,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *params)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *params_local;
  
  writeConfigFile();
  return __return_storage_ptr__;
}

Assistant:

static nite::Console::Result cfWriteconfig(Vector<String> params){
	return writeConfigFile();
}